

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst)

{
  void **ppvVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)vSuper->nSize;
  if (vSuper->nSize < 1) {
    uVar5 = uVar6;
  }
  while (uVar5 != uVar6) {
    ppvVar1 = vSuper->pArray + uVar6;
    uVar6 = uVar6 + 1;
    if ((Abc_Obj_t *)*ppvVar1 == pNode) {
      return 1;
    }
  }
  if ((fFirst == 0) && ((*(uint *)&pNode->field_0x14 & 0x10f) != 0x107)) {
    Vec_PtrPush(vSuper,pNode);
    return 0;
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                  ,0x195,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                  ,0x196,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
  }
  if ((*(uint *)&pNode->field_0x14 >> 8 & 1) == 0) {
    __assert_fail("pNode->fExor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                  ,0x197,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
  }
  plVar2 = (long *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
  iVar3 = Abc_NodeBalanceConeExor_rec
                    (*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8),
                     vSuper,0);
  plVar2 = (long *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
  iVar4 = Abc_NodeBalanceConeExor_rec
                    (*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)(plVar2[4] + 4) * 8)
                     ,vSuper,0);
  return (uint)(iVar4 != 0 || iVar3 != 0);
}

Assistant:

int Abc_NodeBalanceConeExor_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst )
{
    int RetValue1, RetValue2, i;
    // check if the node occurs in the same polarity
    for ( i = 0; i < vSuper->nSize; i++ )
        if ( vSuper->pArray[i] == pNode )
            return 1;
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst && (!pNode->fExor || !Abc_ObjIsNode(pNode)) )
    {
        Vec_PtrPush( vSuper, pNode );
        return 0;
    }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( pNode->fExor );
    // go through the branches
    RetValue1 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin0(Abc_ObjFanin0(pNode)), vSuper, 0 );
    RetValue2 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin1(Abc_ObjFanin0(pNode)), vSuper, 0 );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}